

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_Test3DTileXResource_Test::TestBody
          (CTestGen9Resource_Test3DTileXResource_Test *this)

{
  uint uVar1;
  CTestGen9Resource_Test3DTileXResource_Test *pCVar2;
  CTestGen9Resource_Test3DTileXResource_Test *this_00;
  undefined4 uVar3;
  GMM_RESOURCE_INFO *pGVar4;
  ulong uVar5;
  uint32_t i_2;
  undefined4 *puVar6;
  uint32_t i;
  ulong uVar7;
  uint *puVar8;
  int iVar9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_48;
  CTestGen9Resource_Test3DTileXResource_Test *local_40;
  int *local_38;
  
  local_68 = 0;
  uStack_b0 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_c8 = 3;
  uStack_60 = 0x100000000;
  uStack_c0 = 0x400000000;
  local_b8 = 0x800000000;
  puVar6 = &DAT_001ad0dc;
  puVar8 = (uint *)&DAT_001ac4b4;
  uVar7 = 0;
  local_40 = this;
  do {
    uVar3 = 0;
    if (uVar7 < 5) {
      uVar3 = *puVar6;
    }
    local_c8 = CONCAT44(uVar3,(undefined4)local_c8);
    local_98 = 1;
    uStack_90 = 0x100000001;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar4,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar4,4);
    local_38 = (int *)(ulong)*puVar8;
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,puVar8[-1]);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar4,0x1000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar4,(uint64_t)local_38);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    pCVar2 = local_40;
    uVar7 = uVar7 + 1;
    puVar6 = puVar6 + 1;
    puVar8 = puVar8 + 3;
  } while (uVar7 != 5);
  puVar8 = (uint *)&DAT_001ac4b4;
  local_38 = (int *)0x0;
  uVar7 = 0;
  do {
    uVar3 = 0;
    if (uVar7 < 5) {
      uVar3 = *(undefined4 *)((long)&DAT_001ad0dc + (long)local_38);
    }
    local_c8 = CONCAT44(uVar3,(undefined4)local_c8);
    uVar5 = 0;
    if (uVar7 < 5) {
      uVar5 = (ulong)*(uint *)((long)&DAT_001ad0f0 + (long)local_38);
    }
    uVar1 = puVar8[-1];
    local_98 = (ulong)((int)(uVar1 / uVar5) + 1);
    uStack_90 = 0x100000001;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8,(ulong)uVar1 % uVar5);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)pCVar2,pGVar4,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)pCVar2,pGVar4,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)pCVar2,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)pCVar2,pGVar4,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)pCVar2,pGVar4,0x2000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)pCVar2,pGVar4,(ulong)*puVar8);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))();
    this_00 = local_40;
    uVar7 = uVar7 + 1;
    local_38 = (int *)((long)local_38 + 4);
    puVar8 = puVar8 + 3;
  } while (uVar7 != 5);
  local_38 = (int *)&DAT_001ac4b4;
  local_48 = 0;
  uVar7 = 0;
  do {
    uVar3 = 0;
    if (uVar7 < 5) {
      uVar3 = *(undefined4 *)((long)&DAT_001ad0dc + local_48);
    }
    local_c8 = CONCAT44(uVar3,(undefined4)local_c8);
    uVar5 = 0;
    if (uVar7 < 5) {
      uVar5 = (ulong)*(uint *)((long)&DAT_001ad0f0 + local_48);
    }
    uVar1 = local_38[-1];
    local_98 = (ulong)((int)(uVar1 / uVar5) + 1);
    iVar9 = *local_38;
    uStack_90 = CONCAT44(1,iVar9 + 1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8,(ulong)uVar1 % uVar5);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this_00,pGVar4,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this_00,pGVar4,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this_00,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this_00,pGVar4,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this_00,pGVar4,0x4000);
    CTestResource::VerifyResourceQPitch<true>
              ((CTestResource *)this_00,pGVar4,(ulong)(uint)(iVar9 * 2));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    pCVar2 = local_40;
    uVar7 = uVar7 + 1;
    local_48 = local_48 + 4;
    local_38 = local_38 + 3;
  } while (uVar7 != 5);
  local_38 = (int *)&DAT_001ac4b4;
  local_48 = 0;
  uVar7 = 0;
  do {
    uVar3 = 0;
    if (uVar7 < 5) {
      uVar3 = *(undefined4 *)((long)&DAT_001ad0dc + local_48);
    }
    local_c8 = CONCAT44(uVar3,(undefined4)local_c8);
    uVar5 = 0;
    if (uVar7 < 5) {
      uVar5 = (ulong)*(uint *)((long)&DAT_001ad0f0 + local_48);
    }
    uVar1 = *(uint *)((long)local_38 + -4);
    local_98 = (ulong)((int)(uVar1 / uVar5) + 1);
    iVar9 = (int)*(undefined8 *)local_38;
    uStack_90 = CONCAT44((int)((ulong)*(undefined8 *)local_38 >> 0x20) + 1,iVar9 + 1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8,(ulong)uVar1 % uVar5);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)pCVar2,pGVar4,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)pCVar2,pGVar4,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)pCVar2,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)pCVar2,pGVar4,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)pCVar2,pGVar4,0x8000);
    CTestResource::VerifyResourceQPitch<true>
              ((CTestResource *)pCVar2,pGVar4,(ulong)(uint)(iVar9 * 2));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    uVar7 = uVar7 + 1;
    local_48 = local_48 + 4;
    local_38 = (int *)((long)local_38 + 0xc);
  } while (uVar7 != 5);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test3DTileXResource)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign                    = 16;
    const uint32_t VAlign                    = 4;
    const uint32_t TileSize[TEST_BPP_MAX][3] = {{512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_3D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledX    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = TileSize[i][1] + 1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, 2 * TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y/Z dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = TileSize[i][1] + 1;
        gmmParams.Depth       = TileSize[i][2] + 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * 2 * 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, 2 * TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}